

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_mapping_start(yaml_emitter_t *emitter,yaml_event_t *event)

{
  int iVar1;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  iVar1 = yaml_emitter_process_anchor(emitter);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = yaml_emitter_process_tag(emitter);
  if (iVar1 != 0) {
    if ((((emitter->flow_level == 0) && (emitter->canonical == 0)) &&
        ((event->data).sequence_start.style != YAML_FLOW_SEQUENCE_STYLE)) &&
       (iVar1 = yaml_emitter_check_empty_mapping(emitter), iVar1 == 0)) {
      emitter->state = YAML_EMIT_BLOCK_MAPPING_FIRST_KEY_STATE;
    }
    else {
      emitter->state = YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE;
    }
    return 1;
  }
  return 0;
}

Assistant:

static int
yaml_emitter_emit_mapping_start(yaml_emitter_t *emitter, yaml_event_t *event)
{
    if (!yaml_emitter_process_anchor(emitter))
        return 0;
    if (!yaml_emitter_process_tag(emitter))
        return 0;

    if (emitter->flow_level || emitter->canonical
            || event->data.mapping_start.style == YAML_FLOW_MAPPING_STYLE
            || yaml_emitter_check_empty_mapping(emitter)) {
        emitter->state = YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE;
    }
    else {
        emitter->state = YAML_EMIT_BLOCK_MAPPING_FIRST_KEY_STATE;
    }

    return 1;
}